

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O3

bool __thiscall
vkt::texture::SampleVerifier::verifySampleFiltered
          (SampleVerifier *this,Vec4 *result,IVec3 *baseTexelHiIn,IVec3 *baseTexelLoIn,
          IVec3 *texelGridOffsetHiIn,IVec3 *texelGridOffsetLoIn,int layer,int levelHi,
          Vec2 *lodFracBounds,VkFilter filter,VkSamplerMipmapMode mipmapFilter,ostream *report)

{
  bool bVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  int i;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int level;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Vec3 roundedWeightsLo;
  Vec4 idealSampleHiMax;
  Vec4 idealSampleHiMin;
  IVec3 texelGridOffsetLo;
  IVec3 texelGridOffsetHi;
  IVec3 baseTexelLo;
  IVec3 baseTexelHi;
  Vec4 idealSampleMax;
  Vec4 idealSampleMin;
  Vector<float,_3> res_2;
  Vec3 roundedWeightsHi;
  Vec4 idealSampleLoMax;
  Vec4 idealSampleLoMin;
  undefined1 local_1b0 [12];
  undefined1 auStack_1a4 [12];
  Vector<float,_4> local_198;
  Vector<float,_4> local_188;
  Vec4 *local_170;
  Vector<int,_3> local_168;
  Vector<int,_3> local_158;
  Vector<int,_3> local_148;
  Vector<int,_3> local_138;
  Vector<float,_4> local_128;
  Vector<float,_4> local_118;
  Interval local_108;
  undefined1 local_f0 [12];
  undefined1 auStack_e4 [12];
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  FloatFormat *local_b8;
  double local_b0;
  Interval local_a8;
  Interval local_90;
  Interval local_78;
  Interval local_60;
  Interval local_48;
  
  iVar6 = this->m_coordBits;
  local_138.m_data[2] = baseTexelHiIn->m_data[2];
  local_138.m_data._0_8_ = *(undefined8 *)baseTexelHiIn->m_data;
  iVar13 = 1 << ((byte)this->m_mipmapBits & 0x1f);
  local_148.m_data[2] = baseTexelLoIn->m_data[2];
  local_148.m_data._0_8_ = *(undefined8 *)baseTexelLoIn->m_data;
  local_158.m_data[2] = texelGridOffsetHiIn->m_data[2];
  local_158.m_data._0_8_ = *(undefined8 *)texelGridOffsetHiIn->m_data;
  local_168.m_data[2] = texelGridOffsetLoIn->m_data[2];
  local_168.m_data._0_8_ = *(undefined8 *)texelGridOffsetLoIn->m_data;
  fVar16 = (float)iVar13;
  level = (uint)(levelHi < this->m_imParams->levels + -1) + levelHi;
  local_170 = result;
  fVar14 = floorf(lodFracBounds->m_data[0] * fVar16);
  fVar15 = ceilf(lodFracBounds->m_data[1] * fVar16);
  iVar8 = 0;
  if (0 < (int)fVar14) {
    iVar8 = (int)fVar14;
  }
  if ((int)fVar15 < iVar13) {
    iVar13 = (int)fVar15;
  }
  std::__ostream_insert<char,std::char_traits<char>>(report,"Testing at base texel ",0x16);
  poVar9 = tcu::operator<<(report,&local_138);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = tcu::operator<<(poVar9,&local_148);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," offset ",8);
  poVar9 = tcu::operator<<(poVar9,&local_158);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = tcu::operator<<(poVar9,&local_168);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  local_188.m_data[0] = 0.0;
  local_188.m_data[1] = 0.0;
  local_188.m_data[2] = 0.0;
  local_188.m_data[3] = 0.0;
  local_198.m_data[0] = 0.0;
  local_198.m_data[1] = 0.0;
  local_198.m_data[2] = 0.0;
  local_198.m_data[3] = 0.0;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_c8.m_data[2] = 0.0;
  local_c8.m_data[3] = 0.0;
  local_d8.m_data[0] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_d8.m_data[2] = 0.0;
  local_d8.m_data[3] = 0.0;
  if (filter == VK_FILTER_LINEAR) {
    util::wrapTexelGridCoordLinear(&local_138,&local_158,this->m_coordBits,this->m_imParams->dim);
    if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      util::wrapTexelGridCoordLinear(&local_148,&local_168,this->m_coordBits,this->m_imParams->dim);
    }
    auVar5._12_4_ = 0;
    auVar5._0_12_ = auStack_1a4;
    stack0xfffffffffffffe58 = auVar5 << 0x20;
    local_1b0._0_8_ = 0;
    lVar10 = 0;
    do {
      *(float *)(local_1b0 + lVar10 * 4) = (float)local_158.m_data[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    fVar14 = (float)(1 << ((byte)iVar6 & 0x1f));
    auVar3._12_4_ = 0;
    auVar3._0_12_ = auStack_e4;
    stack0xffffffffffffff18 = auVar3 << 0x20;
    local_f0._0_8_ = 0;
    lVar10 = 0;
    do {
      *(float *)(local_f0 + lVar10 * 4) = *(float *)(local_1b0 + lVar10 * 4) / fVar14;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    local_108.m_lo._0_4_ = 0;
    local_108.m_hasNaN = false;
    local_108._1_7_ = 0;
    lVar10 = 0;
    do {
      *(float *)(&local_108.m_hasNaN + lVar10 * 4) = (float)local_168.m_data[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    auVar4._12_4_ = 0;
    auVar4._0_12_ = auStack_1a4;
    stack0xfffffffffffffe58 = auVar4 << 0x20;
    local_1b0._0_8_ = 0;
    lVar10 = 0;
    do {
      *(float *)(local_1b0 + lVar10 * 4) = *(float *)(&local_108.m_hasNaN + lVar10 * 4) / fVar14;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Computed weights: ",0x12);
    poVar9 = tcu::operator<<(report,(Vector<float,_3> *)local_f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
    poVar9 = tcu::operator<<(poVar9,(Vector<float,_3> *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    getFilteredSample(this,&local_138,(Vector<float,_3> *)local_f0,layer,levelHi,&local_188,
                      &local_198);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Ideal hi sample: ",0x11);
    poVar9 = tcu::operator<<(report,&local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," through ",9);
    poVar9 = tcu::operator<<(poVar9,&local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if (mipmapFilter != VK_SAMPLER_MIPMAP_MODE_LINEAR) {
LAB_00823052:
      if ((local_188.m_data[0] <= local_170->m_data[0]) &&
         (local_170->m_data[0] <= local_198.m_data[0])) {
        uVar7 = 0;
        do {
          uVar11 = uVar7;
          if ((uVar11 == 3) ||
             (fVar14 = local_170->m_data[uVar11 + 1], fVar14 < local_188.m_data[uVar11 + 1])) break;
          uVar7 = uVar11 + 1;
        } while (fVar14 < local_198.m_data[uVar11 + 1] || fVar14 == local_198.m_data[uVar11 + 1]);
        if (2 < uVar11) {
          return true;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(report,"Failed comparison\n",0x12);
      return false;
    }
    getFilteredSample(this,&local_148,(Vec3 *)local_1b0,layer,level,&local_c8,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Ideal lo sample: ",0x11);
    poVar9 = tcu::operator<<(report,&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," through ",9);
    poVar9 = tcu::operator<<(poVar9,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  }
  else {
    fetchTexel(this,&local_138,layer,levelHi,VK_FILTER_NEAREST,&local_188,&local_198);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Ideal hi sample: ",0x11);
    poVar9 = tcu::operator<<(report,&local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," through ",9);
    poVar9 = tcu::operator<<(poVar9,&local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if (mipmapFilter != VK_SAMPLER_MIPMAP_MODE_LINEAR) goto LAB_00823052;
    fetchTexel(this,&local_148,layer,level,VK_FILTER_NEAREST,&local_c8,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Ideal lo sample: ",0x11);
    poVar9 = tcu::operator<<(report,&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," through ",9);
    poVar9 = tcu::operator<<(poVar9,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  }
  if (iVar8 <= iVar13) {
    local_b8 = &this->m_filteringPrecision;
    do {
      fVar14 = (float)iVar8 / fVar16;
      std::__ostream_insert<char,std::char_traits<char>>(report,"Testing at mipmap weight ",0x19);
      dVar19 = (double)fVar14;
      poVar9 = std::ostream::_M_insert<double>(dVar19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      local_118.m_data[0] = 0.0;
      local_118.m_data[1] = 0.0;
      local_118.m_data[2] = 0.0;
      local_118.m_data[3] = 0.0;
      local_128.m_data[0] = 0.0;
      local_128.m_data[1] = 0.0;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 0.0;
      bVar1 = NAN(fVar14);
      dVar17 = INFINITY;
      if (!bVar1) {
        dVar17 = dVar19;
      }
      dVar18 = -INFINITY;
      if (!bVar1) {
        dVar18 = dVar19;
      }
      fVar14 = 1.0 - fVar14;
      local_b0 = -INFINITY;
      dVar19 = INFINITY;
      if (!NAN(fVar14)) {
        local_b0 = (double)fVar14;
        dVar19 = local_b0;
      }
      lVar10 = 0;
      do {
        dVar2 = (double)*(float *)((long)local_d8.m_data + lVar10);
        local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
        unique0x10000314 = SUB84(dVar2,0);
        unique0x1000030c = (double)*(float *)((long)local_c8.m_data + lVar10);
        unique0x10000318 = (int)((ulong)dVar2 >> 0x20);
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
        dVar2 = (double)*(float *)((long)local_198.m_data + lVar10);
        unique0x10000338 = SUB84(dVar2,0);
        unique0x10000330 = (double)*(float *)((long)local_188.m_data + lVar10);
        unique0x1000033c = (int)((ulong)dVar2 >> 0x20);
        local_90.m_hasNaN = bVar1;
        local_90.m_lo = dVar17;
        local_90.m_hi = dVar18;
        tcu::operator*(&local_60,&local_90,(Interval *)local_f0);
        local_a8.m_hi = local_b0;
        local_a8.m_hasNaN = NAN(fVar14);
        local_a8.m_lo = dVar19;
        tcu::operator*(&local_78,&local_a8,(Interval *)local_1b0);
        tcu::operator+(&local_48,&local_60,&local_78);
        tcu::FloatFormat::roundOut(&local_108,local_b8,&local_48,false);
        *(float *)((long)local_118.m_data + lVar10) =
             (float)(double)CONCAT44(local_108.m_lo._4_4_,local_108.m_lo._0_4_);
        *(float *)((long)local_128.m_data + lVar10) = (float)local_108.m_hi;
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(report,"Ideal sample: ",0xe);
      poVar9 = tcu::operator<<(report,&local_118);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," through ",9);
      poVar9 = tcu::operator<<(poVar9,&local_128);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if ((local_118.m_data[0] <= local_170->m_data[0]) &&
         (local_170->m_data[0] <= local_128.m_data[0])) {
        lVar10 = 1;
        do {
          lVar12 = lVar10;
          if ((lVar12 == 4) ||
             (fVar14 = local_170->m_data[lVar12], fVar14 < local_118.m_data[lVar12])) break;
          lVar10 = lVar12 + 1;
        } while (fVar14 < local_128.m_data[lVar12] || fVar14 == local_128.m_data[lVar12]);
        if (2 < lVar12 - 1U) {
          return true;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(report,"Failed comparison\n",0x12);
      iVar8 = iVar8 + 1;
    } while (iVar8 <= iVar13);
  }
  return false;
}

Assistant:

bool SampleVerifier::verifySampleFiltered (const Vec4&			result,
										   const IVec3&			baseTexelHiIn,
										   const IVec3&			baseTexelLoIn,
										   const IVec3&			texelGridOffsetHiIn,
										   const IVec3&			texelGridOffsetLoIn,
										   int					layer,
										   int					levelHi,
										   const Vec2&			lodFracBounds,
										   VkFilter				filter,
										   VkSamplerMipmapMode	mipmapFilter,
										   std::ostream&		report) const
{
	DE_ASSERT(layer < m_imParams.arrayLayers);
	DE_ASSERT(levelHi < m_imParams.levels);

	const int	coordSteps			= 1 << m_coordBits;
	const int	lodSteps			= 1 << m_mipmapBits;
	const int	levelLo				= (levelHi < m_imParams.levels - 1) ? levelHi + 1 : levelHi;

	IVec3		baseTexelHi			= baseTexelHiIn;
	IVec3		baseTexelLo			= baseTexelLoIn;
	IVec3		texelGridOffsetHi	= texelGridOffsetHiIn;
	IVec3		texelGridOffsetLo	= texelGridOffsetLoIn;
	deInt32		lodStepsMin			= 0;
	deInt32		lodStepsMax			= 0;

	getMipmapStepBounds(lodFracBounds, lodStepsMin, lodStepsMax);

	report << "Testing at base texel " << baseTexelHi << ", " << baseTexelLo << " offset " << texelGridOffsetHi << ", " << texelGridOffsetLo << "\n";

	Vec4 idealSampleHiMin;
	Vec4 idealSampleHiMax;
	Vec4 idealSampleLoMin;
	Vec4 idealSampleLoMax;

	// Get ideal samples at steps at each mipmap level

	if (filter == VK_FILTER_LINEAR)
	{
		// Adjust texel grid coordinates for linear filtering
		wrapTexelGridCoordLinear(baseTexelHi, texelGridOffsetHi, m_coordBits, m_imParams.dim);

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
			wrapTexelGridCoordLinear(baseTexelLo, texelGridOffsetLo, m_coordBits, m_imParams.dim);
		}

		const Vec3 roundedWeightsHi = texelGridOffsetHi.asFloat() / (float)coordSteps;
		const Vec3 roundedWeightsLo = texelGridOffsetLo.asFloat() / (float)coordSteps;

		report << "Computed weights: " << roundedWeightsHi << ", " << roundedWeightsLo << "\n";

	    getFilteredSample(baseTexelHi, roundedWeightsHi, layer, levelHi, idealSampleHiMin, idealSampleHiMax);

		report << "Ideal hi sample: " << idealSampleHiMin << " through " << idealSampleHiMax << "\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
		    getFilteredSample(baseTexelLo, roundedWeightsLo, layer, levelLo, idealSampleLoMin, idealSampleLoMax);

			report << "Ideal lo sample: " << idealSampleLoMin << " through " << idealSampleLoMax << "\n";
		}
	}
	else
	{
	    fetchTexel(baseTexelHi, layer, levelHi, VK_FILTER_NEAREST, idealSampleHiMin, idealSampleHiMax);

		report << "Ideal hi sample: " << idealSampleHiMin << " through " << idealSampleHiMax << "\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
		    fetchTexel(baseTexelLo, layer, levelLo, VK_FILTER_NEAREST, idealSampleLoMin, idealSampleLoMax);

			report << "Ideal lo sample: " << idealSampleLoMin << " through " << idealSampleLoMax << "\n";
		}
	}

	// Test ideal samples based on mipmap filtering mode

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
	{
		for (deInt32 lodStep = lodStepsMin; lodStep <= lodStepsMax; ++lodStep)
		{
			float weight = (float)lodStep / (float)lodSteps;

			report << "Testing at mipmap weight " << weight << "\n";

			Vec4 idealSampleMin;
			Vec4 idealSampleMax;

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				const Interval idealSampleLo(false, idealSampleLoMin[compNdx], idealSampleLoMax[compNdx]);
				const Interval idealSampleHi(false, idealSampleHiMin[compNdx], idealSampleHiMax[compNdx]);

				const Interval idealSample
					= m_filteringPrecision.roundOut(Interval(weight) * idealSampleLo + Interval(1.0f - weight) * idealSampleHi, false);

				idealSampleMin[compNdx] = (float)idealSample.lo();
				idealSampleMax[compNdx] = (float)idealSample.hi();
			}

			report << "Ideal sample: " << idealSampleMin << " through " << idealSampleMax << "\n";

			if (isInRange(result, idealSampleMin, idealSampleMax))
			{
				return true;
			}
			else
			{
				report << "Failed comparison\n";
			}
		}
	}
	else
	{
		if (isInRange(result, idealSampleHiMin, idealSampleHiMax))
		{
			return true;
		}
		else
		{
			report << "Failed comparison\n";
		}
	}

	return false;
}